

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O0

void __thiscall
mp::internal::TextReader<fmt::Locale>::DoReportError
          (TextReader<fmt::Locale> *this,char *loc,CStringRef format_str,ArgList *args)

{
  CStringRef format_str_00;
  ArgList args_00;
  int iVar1;
  int line_00;
  undefined8 uVar2;
  CStringRef in_RCX;
  anon_union_8_2_de49483c_for_ArgList_1 in_RDX;
  ReadError *in_RSI;
  uint64_t in_RDI;
  bool bVar3;
  int column;
  char *line_start;
  int line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  BasicCStringRef<char> *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffffc8;
  ReadError *this_00;
  undefined4 in_stack_ffffffffffffffd8;
  int local_18;
  
  iVar1 = *(int *)(in_RDI + 0x48);
  this_00 = *(ReadError **)(in_RDI + 0x40);
  if (in_RSI < this_00) {
    iVar1 = iVar1 + -1;
    this_00 = in_RSI;
    if ((in_RSI->super_Error).super_RuntimeError.super_runtime_error == (runtime_error)0xa) {
      this_00 = (ReadError *)((long)&in_RSI[-1].column_ + 3);
    }
    while( true ) {
      bVar3 = false;
      if ((this_00->super_Error).super_RuntimeError.super_runtime_error != (runtime_error)0xa) {
        bVar3 = this_00 != *(ReadError **)(in_RDI + 8);
      }
      if (!bVar3) break;
      this_00 = (ReadError *)((long)&this_00[-1].column_ + 3);
    }
    if ((this_00->super_Error).super_RuntimeError.super_runtime_error == (runtime_error)0xa) {
      this_00 = (ReadError *)&(this_00->super_Error).super_RuntimeError.field_0x1;
    }
  }
  local_18 = (int)in_RSI;
  line_00 = (local_18 - (int)this_00) + 1;
  uVar2 = __cxa_allocate_exception(0x40);
  fmt::BasicCStringRef<char>::BasicCStringRef(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  format_str_00.data_._4_4_ = iVar1;
  format_str_00.data_._0_4_ = in_stack_ffffffffffffffd8;
  args_00.field_1.args_ = in_RDX.args_;
  args_00.types_ = in_RDI;
  ReadError::ReadError(this_00,in_RCX,line_00,in_stack_ffffffffffffffc8,format_str_00,args_00);
  __cxa_throw(uVar2,&ReadError::typeinfo,ReadError::~ReadError);
}

Assistant:

void mp::internal::TextReader<Locale>::DoReportError(
    const char *loc, fmt::CStringRef format_str, const fmt::ArgList &args) {
  int line = line_;
  const char *line_start = line_start_;
  if (loc < line_start) {
    --line;
    // Find the beginning of the previous line.
    line_start = loc;
    if (*line_start == '\n')
      --line_start;
    while (*line_start != '\n' && line_start != start_)
      --line_start;
    if (*line_start == '\n')
      ++line_start;
  }
  int column = static_cast<int>(loc - line_start + 1);
  throw ReadError(name_, line, column, format_str, args);
}